

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfSection(Assembler *this,string *line)

{
  bool bVar1;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_vector<char>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_list<relocationTableEntry>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  string local_158;
  string local_138;
  _Base_ptr local_118;
  undefined1 local_110;
  list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_> local_108;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>
  local_f0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
  local_a8;
  undefined1 local_70 [8];
  string name;
  undefined1 local_40 [8];
  smatch sectionName;
  string *line_local;
  Assembler *this_local;
  
  sectionName._M_begin._M_current = (char *)line;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_40);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_40,&sectionDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)local_70,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,1);
    if ((first & 1U) == 0) {
      std::__cxx11::string::string((string *)&local_158,(string *)local_70);
      processSectionSecondPass(this,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      std::make_pair<std::__cxx11::string&,std::vector<char,std::allocator<char>>&>
                (&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &this->bytes);
      _Var2 = std::
              map<std::__cxx11::string,std::vector<char,std::allocator<char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
              ::insert<std::pair<std::__cxx11::string,std::vector<char,std::allocator<char>>>>
                        ((map<std::__cxx11::string,std::vector<char,std::allocator<char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
                          *)&this->codeBySection,&local_a8);
      local_b8 = (_Base_ptr)_Var2.first._M_node;
      local_b0 = _Var2.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
      ::~pair(&local_a8);
      local_108.
      super__List_base<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      local_108.
      super__List_base<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      local_108.
      super__List_base<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
      ._M_impl._M_node._M_size = 0;
      std::__cxx11::
      list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::list
                (&local_108);
      std::
      make_pair<std::__cxx11::string&,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>
                (&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_108);
      _Var3 = std::
              map<std::__cxx11::string,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>>
              ::
              insert<std::pair<std::__cxx11::string,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>
                        ((map<std::__cxx11::string,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>>
                          *)&this->relocationTable,&local_f0);
      local_118 = (_Base_ptr)_Var3.first._M_node;
      local_110 = _Var3.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>
      ::~pair(&local_f0);
      std::__cxx11::
      list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::~list
                (&local_108);
      std::__cxx11::string::string((string *)&local_138,(string *)local_70);
      processSectionFirstPass(this,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      isGlobalFirst = false;
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfSection(string line) {
    smatch sectionName;
    if (regex_match(line, sectionName, sectionDirectiveReg)) {
        string name = sectionName.str(1);
        if (first) {
            codeBySection.insert(make_pair(name, bytes));
            relocationTable.insert(make_pair(name, list<relocationTableEntry>()));
            processSectionFirstPass(name);
            isGlobalFirst = false;
        } else processSectionSecondPass(name);
        return true;
    }
    return false;
}